

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_mconfig.cpp
# Opt level: O1

void test_save_and_load_with_inifile<int>(int userValue,QString *filepath)

{
  SimpleConfig<int> config2;
  SimpleConfig<int> config1;
  Format local_ac;
  SimpleConfig<int> local_a8;
  SimpleConfig<int> local_60;
  
  SimpleConfig<int>::SimpleConfig(&local_60);
  local_a8.super_MConfig.super_MBaseConfig._vptr_MBaseConfig =
       (_func_int **)CONCAT44(local_a8.super_MConfig.super_MBaseConfig._vptr_MBaseConfig._4_4_,1);
  local_60.value = userValue;
  MBaseConfig::save((MBaseConfig *)&local_60,filepath,(Format *)&local_a8);
  SimpleConfig<int>::SimpleConfig(&local_a8);
  local_ac = IniFormat;
  MBaseConfig::load((MBaseConfig *)&local_a8,filepath,&local_ac);
  QTest::qCompare(local_60.value,local_a8.value,"config1.value","config2.value",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/milosolutions[P]mconfig/tst_mconfig/tst_mconfig.cpp"
                  ,0x6f);
  local_a8.super_MConfig.super_MBaseConfig._vptr_MBaseConfig = (_func_int **)&PTR__MConfig_0010dd50;
  QHash<QByteArray,_MConfig::ValuePtr>::~QHash(&local_a8.super_MConfig.mValues);
  MBaseConfig::~MBaseConfig((MBaseConfig *)&local_a8);
  local_60.super_MConfig.super_MBaseConfig._vptr_MBaseConfig = (_func_int **)&PTR__MConfig_0010dd50;
  QHash<QByteArray,_MConfig::ValuePtr>::~QHash(&local_60.super_MConfig.mValues);
  MBaseConfig::~MBaseConfig((MBaseConfig *)&local_60);
  return;
}

Assistant:

void test_save_and_load_with_inifile(T userValue, const QString& filepath)
{
    SimpleConfig<T> config1;
    config1.value = userValue;
    config1.save(filepath);
    SimpleConfig<T> config2;
    config2.load(filepath);
    QCOMPARE(config1.value, config2.value);
}